

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::moveCursor(QWidgetLineControl *this,int pos,bool mark)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  int *piVar5;
  byte in_DL;
  int in_ESI;
  QWidgetLineControl *in_RDI;
  long in_FS_OFFSET;
  QWidgetLineControl *unaff_retaddr;
  int anchor;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int pos_00;
  undefined7 in_stack_ffffffffffffffe0;
  int local_10;
  int local_c [2];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_DL & 1;
  local_c[0] = in_ESI;
  commitPreedit((QWidgetLineControl *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
  ;
  if (local_c[0] != in_RDI->m_cursor) {
    separate((QWidgetLineControl *)in_RDI);
    bVar4 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                        *)0x5dd26f);
    if (bVar4) {
      pos_00 = (int)((ulong)in_RDI >> 0x20);
      if (in_RDI->m_cursor < local_c[0]) {
        local_c[0] = nextMaskBlank((QWidgetLineControl *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),
                                   pos_00);
      }
      else {
        local_c[0] = prevMaskBlank((QWidgetLineControl *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),
                                   pos_00);
      }
    }
  }
  if ((bVar3 & 1) == 0) {
    internalDeselect((QWidgetLineControl *)in_RDI);
  }
  else {
    if ((in_RDI->m_selstart < in_RDI->m_selend) && (in_RDI->m_cursor == in_RDI->m_selstart)) {
      local_10 = in_RDI->m_selend;
    }
    else if ((in_RDI->m_selstart < in_RDI->m_selend) && (in_RDI->m_cursor == in_RDI->m_selend)) {
      local_10 = in_RDI->m_selstart;
    }
    else {
      local_10 = in_RDI->m_cursor;
    }
    piVar5 = qMin<int>(&local_10,local_c);
    in_RDI->m_selstart = *piVar5;
    piVar5 = qMax<int>(&local_10,local_c);
    lVar2 = stack0xfffffffffffffff8;
    in_RDI->m_selend = *piVar5;
    uVar1 = (ulong)stack0xfffffffffffffff8 >> 0x38;
    bVar4 = SUB81(uVar1,0);
    unique0x10000243 = lVar2;
    updateDisplayText(unaff_retaddr,bVar4);
  }
  in_RDI->m_cursor = local_c[0];
  if (((bVar3 & 1) != 0) || ((*(ushort *)&in_RDI->field_0x50 >> 7 & 1) != 0)) {
    *(ushort *)&in_RDI->field_0x50 = *(ushort *)&in_RDI->field_0x50 & 0xff7f;
    selectionChanged((QWidgetLineControl *)0x5dd3d0);
  }
  emitCursorPositionChanged(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::moveCursor(int pos, bool mark)
{
    commitPreedit();

    if (pos != m_cursor) {
        separate();
        if (m_maskData)
            pos = pos > m_cursor ? nextMaskBlank(pos) : prevMaskBlank(pos);
    }
    if (mark) {
        int anchor;
        if (m_selend > m_selstart && m_cursor == m_selstart)
            anchor = m_selend;
        else if (m_selend > m_selstart && m_cursor == m_selend)
            anchor = m_selstart;
        else
            anchor = m_cursor;
        m_selstart = qMin(anchor, pos);
        m_selend = qMax(anchor, pos);
        updateDisplayText();
    } else {
        internalDeselect();
    }
    m_cursor = pos;
    if (mark || m_selDirty) {
        m_selDirty = false;
        emit selectionChanged();
    }
    emitCursorPositionChanged();
}